

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  code *pcVar1;
  uint newSize;
  Type TVar2;
  bool bVar3;
  uint uVar4;
  EntryType *dst;
  undefined4 *puVar5;
  uint uVar6;
  uint bucketCount;
  ulong uVar7;
  uint uVar8;
  hash_t hashCode;
  int *piVar9;
  int iVar10;
  long lVar11;
  Type local_40;
  int *newBuckets;
  
  uVar6 = this->count;
  newSize = uVar6 * 2;
  bucketCount = 4;
  if (8 < newSize) {
    bucketCount = uVar6 & 0x7fffffff;
    if ((uVar6 - 1 & bucketCount) != 0) {
      iVar10 = 0x1f;
      if (bucketCount != 0) {
        for (; bucketCount >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      bucketCount = 1 << (-((byte)iVar10 ^ 0x1f) & 0x1f);
    }
  }
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,Memory::WriteBarrierPtr<void>>,Memory::WriteBarrierPtr<void>,Memory::RecyclerNonLeafAllocator>
              (dst,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::DictionaryEntry<Js::InternalString,Memory::WriteBarrierPtr<void>>,Memory::WriteBarrierPtr<void>,Memory::RecyclerNonLeafAllocator>
              ((DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_> *)newBuckets,
               (long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar10 = this->count;
    if (0 < iVar10) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar11 = 0;
      piVar9 = newBuckets;
      do {
        if (-2 < piVar9[lVar11 * 10 + 2]) {
          if ((ulong)(uint)piVar9[lVar11 * 10 + 4] == 0) {
            hashCode = 0x2393b8b;
          }
          else {
            uVar6 = 0x811c9dc5;
            uVar7 = 0;
            do {
              uVar8 = *(ushort *)
                       ((ulong)((uint)*(byte *)(piVar9 + lVar11 * 10 + 5) * 2) +
                        *(long *)(piVar9 + lVar11 * 10 + 6) + uVar7 * 2) ^ uVar6;
              uVar6 = uVar8 * 0x1000193;
              uVar7 = uVar7 + 1;
            } while ((uint)piVar9[lVar11 * 10 + 4] != uVar7);
            hashCode = uVar8 * 0x2000326 + 1;
          }
          if (hashCode != piVar9[lVar11 * 10 + 8]) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                               ,0xce,
                               "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                               ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
            hashCode = piVar9[lVar11 * 10 + 8];
          }
          uVar4 = GetBucket(hashCode,bucketCount,this->modFunctionIndex);
          newBuckets[lVar11 * 10 + 2] = local_40.ptr[(int)uVar4];
          local_40.ptr[(int)uVar4] = (int)lVar11;
          iVar10 = this->count;
          piVar9 = newBuckets;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar10);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar2.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar2.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar9 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_> *)piVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }